

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O2

_Bool X86_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *_info)

{
  cs_detail *pcVar1;
  cs_insn *pcVar2;
  byte bVar3;
  uint16_t uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  x86_reg xVar9;
  ulong uVar10;
  uint8_t uVar11;
  undefined *puVar12;
  OperandSpecifier *pOVar13;
  Reg reg;
  DisassemblerMode mode;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  ulong uStack_1b0;
  reader_info info;
  InternalInstruction insn;
  
  memset(&insn,0,0x150);
  pcVar1 = instr->flat_insn->detail;
  info.code = code;
  info.size = code_len;
  info.offset = address;
  if (pcVar1 != (cs_detail *)0x0) {
    memset(pcVar1,0,0x228);
  }
  mode = ((*(uint *)(ud + 4) & 4) == 0) + MODE_32BIT;
  if ((*(uint *)(ud + 4) & 2) != 0) {
    mode = MODE_16BIT;
  }
  iVar5 = decodeInstruction(&insn,reader,&info,address,mode);
  if (iVar5 != 0) {
    uVar4 = (uint16_t)(insn.readerCursor - address);
    *size = uVar4;
    if (uVar4 == 4) {
      if (*(int *)(ud + 4) != 2) {
        uVar15 = address - info.offset;
        if (uVar15 < info.size) {
          bVar16 = info.code[uVar15] == 0xf3;
        }
        else {
          bVar16 = false;
        }
        if (uVar15 + 1 < info.size) {
          bVar17 = info.code[uVar15 + 1] == '\x0f';
        }
        else {
          bVar17 = false;
        }
        if (uVar15 + 2 < info.size) {
          bVar18 = info.code[uVar15 + 2] == '\x1e';
        }
        else {
          bVar18 = false;
        }
        if (uVar15 + 3 < info.size) {
          uVar11 = info.code[uVar15 + 3];
        }
        else {
          uVar11 = '\0';
        }
        bVar18 = (bool)(bVar16 & bVar17 & bVar18);
        if ((bVar18) && (uVar11 == 0xfa)) {
          instr->Opcode = 0x2297;
          instr->OpcodePub = 0x5dc;
          builtin_strncpy(instr->assembly,"endbr64",8);
          pcVar1 = instr->flat_insn->detail;
          if (pcVar1 == (cs_detail *)0x0) {
            return true;
          }
          (pcVar1->field_6).x86.opcode[0] = 0xf3;
          (instr->flat_insn->detail->field_6).x86.opcode[1] = '\x0f';
          (instr->flat_insn->detail->field_6).x86.opcode[2] = '\x1e';
          (instr->flat_insn->detail->field_6).x86.opcode[3] = 0xfa;
          return true;
        }
        if ((bool)(bVar18 & uVar11 == 0xfb)) {
          instr->Opcode = 0x2296;
          instr->OpcodePub = 0x5db;
          builtin_strncpy(instr->assembly,"endbr32",8);
          pcVar1 = instr->flat_insn->detail;
          if (pcVar1 == (cs_detail *)0x0) {
            return true;
          }
          (pcVar1->field_6).x86.opcode[0] = 0xf3;
          (instr->flat_insn->detail->field_6).x86.opcode[1] = '\x0f';
          (instr->flat_insn->detail->field_6).x86.opcode[2] = '\x1e';
          (instr->flat_insn->detail->field_6).x86.opcode[3] = 0xfb;
          return true;
        }
      }
    }
    else if (((uint)(insn.readerCursor - address) & 0xffff) == 2) {
      uVar15 = address - info.offset;
      bVar16 = true;
      if (uVar15 < info.size) {
        bVar16 = info.code[uVar15] != '\x0f';
      }
      if ((uVar15 + 1 < info.size) && (!bVar16 && info.code[uVar15 + 1] == 0xff)) {
        instr->Opcode = 0x2295;
        instr->OpcodePub = 0x5da;
        builtin_strncpy(instr->assembly,"ud0",4);
        pcVar1 = instr->flat_insn->detail;
        if (pcVar1 == (cs_detail *)0x0) {
          return true;
        }
        (pcVar1->field_6).x86.opcode[0] = '\x0f';
        (instr->flat_insn->detail->field_6).x86.opcode[1] = 0xff;
        return true;
      }
    }
    goto switchD_0021b7fc_caseD_b;
  }
  *size = (uint16_t)insn.length;
  if (insn.spec == (InstructionSpecifier *)0x0) goto switchD_0021b7fc_caseD_b;
  MCInst_setOpcode(instr,(uint)insn.instructionID);
  if (insn.xAcquireRelease == true) {
    uVar6 = MCInst_getOpcode(instr);
    uVar7 = 0x2281;
    if (uVar6 != 0x980) {
      uVar6 = MCInst_getOpcode(instr);
      uVar7 = 0x2238;
      if (uVar6 != 0x978) goto LAB_0021b7a3;
    }
    MCInst_setOpcode(instr,uVar7);
  }
LAB_0021b7a3:
  insn.numImmediatesTranslated = '\0';
  lVar14 = 0;
LAB_0021b7bc:
  if (lVar14 != 6) {
    uVar11 = insn.operands[lVar14].encoding;
    if (uVar11 != '\0') {
      pOVar13 = insn.operands + lVar14;
LAB_0021b7e5:
      switch(uVar11) {
      case '\x01':
        goto switchD_0021b7fc_caseD_1;
      case '\x02':
      case '\x03':
      case '\x04':
      case '\x05':
      case '\x06':
      case '\a':
      case '\b':
        switch(pOVar13->type) {
        case '\b':
        case '\t':
        case '\n':
        case '\v':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
        case ':':
        case ';':
        case '>':
        case '?':
        case 'D':
        case 'E':
        case 'G':
          if (insn.eaBase == EA_BASE_sib) {
            return false;
          }
          if (insn.eaBase == EA_BASE_sib64) {
            return false;
          }
          if (insn.eaBase - EA_REG_AL < 0xdb) {
            uVar6 = *(uint *)(&DAT_003cc728 + (ulong)(insn.eaBase - EA_REG_AL) * 4);
            break;
          }
          goto switchD_0021b7fc_caseD_b;
        default:
          goto switchD_0021b823_caseD_c;
        case '\x18':
        case '\x19':
        case '\x1a':
        case '\x1b':
        case '\x1c':
        case '\x1d':
        case '\x1e':
        case '\x1f':
        case ' ':
        case '!':
        case '\"':
        case '0':
        case '1':
        case '2':
        case 'F':
        case 'O':
          goto code_r0x0021b8eb;
        }
      case '\t':
        reg = insn.vvvv;
        goto LAB_0021b8cd;
      case '\n':
        if ((insn.writemask & (MODRM_REG_DR6|MODRM_REG_RSP)) != MODRM_REG_AL)
        goto switchD_0021b7fc_caseD_b;
        uVar6 = insn.writemask + MODRM_REG_XMM14 & 0x7f;
        break;
      default:
        goto switchD_0021b7fc_caseD_b;
      case '\x11':
      case '\x12':
      case '\x13':
      case '\x14':
      case '\x1a':
      case '\x1b':
        uVar15 = (ulong)insn.numImmediatesTranslated;
        insn.numImmediatesTranslated = insn.numImmediatesTranslated + '\x01';
        uVar15 = insn.immediates[uVar15];
        bVar3 = pOVar13->type;
        switch(bVar3) {
        case 0xc:
        case 0xd:
        case 0xe:
        case 0xf:
switchD_0021b899_caseD_c:
          if (uVar11 == '\x13') {
            uVar10 = uVar15 | 0xffffffff00000000;
            bVar16 = (int)(uint)uVar15 < 0;
          }
          else if (uVar11 == '\x12') {
            uVar10 = uVar15 | 0xffffffffffff0000;
            bVar16 = (short)uVar15 < 0;
          }
          else {
            if (uVar11 != '\x11') goto LAB_0021bb13;
            uVar10 = uVar15 | 0xffffffffffffff00;
            bVar16 = (char)uVar15 < '\0';
          }
          if (bVar16) {
            uVar15 = uVar10;
          }
LAB_0021bb13:
          if (bVar3 - 0x36 < 3) {
            uVar6 = ((uint)uVar15 >> 4) + 0x7a;
            goto LAB_0021bf79;
          }
          if (bVar3 - 3 < 2) goto LAB_0021bb5b;
          if (bVar3 != 1) {
            if (bVar3 == 0x39) {
              uVar6 = ((uint)uVar15 >> 4) + 0x9a;
            }
            else {
              if (bVar3 != 0x3a) break;
              uVar6 = ((uint)(uVar15 >> 4) & 0xfffffff) + 0xba;
            }
            goto LAB_0021bf79;
          }
LAB_0021bc3a:
          uVar10 = uVar15 | 0xffffffffffffff00;
          bVar16 = (char)uVar15 < '\0';
          goto LAB_0021bc8a;
        case 0x10:
          if (7 < uVar15) {
            uVar6 = MCInst_getOpcode(instr);
            switch(uVar6) {
            case 0x19f5:
              uVar6 = 0x19f6;
              break;
            case 0x19f6:
            case 0x19f8:
            case 0x19fa:
            case 0x19fc:
            case 0x19fe:
            case 0x1a00:
            case 0x1a02:
            case 0x1a04:
            case 0x1a06:
            case 0x1a08:
            case 0x1a0a:
              goto switchD_0021bc31_caseD_19f6;
            case 0x19f7:
              uVar6 = 0x19f8;
              break;
            case 0x19f9:
              uVar6 = 0x19fa;
              break;
            case 0x19fb:
              uVar6 = 0x19fc;
              break;
            case 0x19fd:
              uVar6 = 0x19fe;
              break;
            case 0x19ff:
              uVar6 = 0x1a00;
              break;
            case 0x1a01:
              uVar6 = 0x1a02;
              break;
            case 0x1a03:
              uVar6 = 0x1a04;
              break;
            case 0x1a05:
              uVar6 = 0x1a06;
              break;
            case 0x1a07:
              uVar6 = 0x1a08;
              break;
            case 0x1a09:
              uVar6 = 0x1a0a;
              break;
            case 0x1a0b:
              uVar6 = 0x1a0c;
              break;
            default:
              switch(uVar6) {
              case 0x230:
                uVar6 = 0x231;
                break;
              case 0x231:
              case 0x233:
              case 0x235:
              case 0x237:
              case 0x238:
              case 0x23a:
              case 0x23c:
              case 0x23d:
              case 0x23e:
              case 0x240:
                goto switchD_0021bc31_caseD_19f6;
              case 0x232:
                uVar6 = 0x233;
                break;
              case 0x234:
                uVar6 = 0x235;
                break;
              case 0x236:
                uVar6 = 0x237;
                break;
              case 0x239:
                uVar6 = 0x23a;
                break;
              case 0x23b:
                uVar6 = 0x23c;
                break;
              case 0x23f:
                uVar6 = 0x240;
                break;
              case 0x241:
                uVar6 = 0x242;
                break;
              default:
                switch(uVar6) {
                case 0x19db:
                  uVar6 = 0x19dc;
                  break;
                default:
                  goto switchD_0021bc31_caseD_19f6;
                case 0x19dd:
                  uVar6 = 0x19de;
                  break;
                case 0x19df:
                  uVar6 = 0x19e0;
                  break;
                case 0x19e1:
                  uVar6 = 0x19e2;
                }
              }
            }
LAB_0021bbf5:
            MCInst_setOpcode(instr,uVar6);
          }
          break;
        case 0x11:
          if (0x1f < uVar15) {
            uVar7 = MCInst_getOpcode(instr);
            uVar7 = uVar7 - 0xcc5;
            if ((uVar7 < 0x2b) && ((0x55555555555U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) {
              puVar12 = &DAT_003ccd18;
LAB_0021bbf2:
              uVar6 = *(uint *)(puVar12 + (ulong)uVar7 * 4);
              goto LAB_0021bbf5;
            }
          }
          break;
        case 0x12:
          if (7 < uVar15 || (~(uint)uVar15 & 3) == 0) {
            uVar6 = MCInst_getOpcode(instr);
            uVar7 = (uVar6 - 0x1843 >> 1 | (uint)((uVar6 - 0x1843 & 1) != 0) << 0x1f) - 1;
            uVar6 = 0x1844;
            if (uVar7 < 0xcb) {
              puVar12 = &DAT_003ccdc4;
              goto LAB_0021bbf2;
            }
            goto LAB_0021bbf5;
          }
          break;
        default:
          if (bVar3 == 0x48) goto switchD_0021b899_caseD_c;
          if (bVar3 != 0x49) goto LAB_0021bb13;
          if (insn.displacementSize != '\x04') {
            if (insn.displacementSize != '\x02') {
              if (insn.displacementSize != '\x01') break;
              goto LAB_0021bc3a;
            }
            uVar10 = uVar15 | 0xffffffffffff0000;
            bVar16 = (short)uVar15 < 0;
            goto LAB_0021bc8a;
          }
LAB_0021bb5b:
          uVar10 = uVar15 | 0xffffffff00000000;
          bVar16 = (int)uVar15 < 0;
LAB_0021bc8a:
          if (bVar16) {
            uVar15 = uVar10;
          }
        }
switchD_0021bc31_caseD_19f6:
        MCOperand_CreateImm0(instr,uVar15);
        if (3 < (byte)(bVar3 - 0x2b)) goto LAB_0021bf7e;
        uVar6 = (uint)""[insn.segmentOverride];
        break;
      case '\x15':
      case '\x16':
      case '\x17':
      case '\x18':
      case '\x1c':
        reg = insn.opcodeRegister;
        goto LAB_0021b8cd;
      case '\x19':
        uVar6 = (insn.modRM & 7) + 0x72;
        break;
      case '\x1d':
        goto switchD_0021b7fc_caseD_1d;
      case '\x1e':
        bVar3 = insn.isPrefix67;
        if (insn.mode == MODE_32BIT) {
LAB_0021bc57:
          uVar6 = (uint)bVar3 * 0x10 + 0x1d;
        }
        else {
          if (insn.mode != MODE_64BIT) {
            bVar3 = insn.isPrefix67 ^ 1;
            goto LAB_0021bc57;
          }
          uVar6 = 0x2b;
          if (insn.isPrefix67 != false) {
            uVar6 = 0x1d;
          }
        }
        MCOperand_CreateReg0(instr,uVar6);
        goto LAB_0021bf64;
      case '\x1f':
        if (insn.mode == MODE_32BIT) {
          bVar3 = insn.isPrefix67 ^ 1;
        }
        else {
          bVar3 = insn.isPrefix67;
          if (insn.mode == MODE_64BIT) {
            uVar6 = (uint)(insn.isPrefix67 ^ 1) * 0x10 + 0x17;
            break;
          }
        }
        uVar6 = (uint)bVar3 + (uint)bVar3 * 8 + 0xe;
      }
      goto LAB_0021bf79;
    }
    goto LAB_0021bf7e;
  }
  if ((((*(byte *)(ud + 4) & 8) == 0) || (uVar6 = instr->Opcode - 0x4c3, 0x1b < uVar6)) ||
     ((0xc000003U >> (uVar6 & 0x1f) & 1) == 0)) {
    instr->imm_size = insn.immSize;
    if (*(int *)(ud + 0x60) == 0) {
      instr->x86_prefix[0] = insn.prefix0;
      instr->x86_prefix[1] = insn.prefix1;
      instr->x86_prefix[2] = insn.prefix2;
      instr->x86_prefix[3] = insn.prefix3;
      return true;
    }
    pcVar2 = instr->flat_insn;
    instr->x86_prefix[0] = insn.prefix0;
    instr->x86_prefix[1] = insn.prefix1;
    instr->x86_prefix[2] = insn.prefix2;
    instr->x86_prefix[3] = insn.prefix3;
    if (insn.vectorExtensionType == TYPE_NO_VEX_XOP) {
      if (insn.twoByteEscape == '\0') {
        (pcVar2->detail->field_6).x86.opcode[0] = insn.opcode;
      }
      else {
        (pcVar2->detail->field_6).x86.opcode[0] = insn.twoByteEscape;
        if (insn.threeByteEscape == '\0') {
          (pcVar2->detail->field_6).x86.opcode[1] = insn.opcode;
        }
        else {
          (pcVar2->detail->field_6).x86.opcode[1] = insn.threeByteEscape;
          (pcVar2->detail->field_6).x86.opcode[2] = insn.opcode;
        }
      }
    }
    else {
      (pcVar2->detail->field_6).arm.vector_size = (int)insn.vectorExtensionPrefix;
    }
    (pcVar2->detail->field_6).x86.rex = insn.rexPrefix;
    (pcVar2->detail->field_6).x86.addr_size = insn.addressSize;
    (pcVar2->detail->field_6).x86.modrm = insn.orgModRM;
    (pcVar2->detail->field_6).x86.encoding.modrm_offset = insn.modRMOffset;
    (pcVar2->detail->field_6).x86.sib = insn.sib;
    xVar9 = x86_map_sib_index(insn.sibIndex);
    (pcVar2->detail->field_6).x86.sib_index = xVar9;
    (pcVar2->detail->field_6).x86.sib_scale = insn.sibScale;
    xVar9 = x86_map_sib_base(insn.sibBase);
    (pcVar2->detail->field_6).x86.sib_base = xVar9;
    (pcVar2->detail->field_6).x86.disp = insn.displacement;
    if (insn.consumedDisplacement == true) {
      (pcVar2->detail->field_6).x86.encoding.disp_offset = insn.displacementOffset;
      (pcVar2->detail->field_6).x86.encoding.disp_size = insn.displacementSize;
    }
    (pcVar2->detail->field_6).x86.encoding.imm_offset = insn.immediateOffset;
    if (insn.immediateOffset == '\0' || (pcVar2->detail->field_6).x86.encoding.imm_size != '\0') {
      return true;
    }
    (pcVar2->detail->field_6).x86.encoding.imm_size = insn.immediateSize;
    return true;
  }
switchD_0021b7fc_caseD_b:
switchD_0021b823_caseD_c:
  return false;
switchD_0021b7fc_caseD_1d:
  pOVar13 = insn.operands + ((ulong)pOVar13->type - 0x4a);
  uVar11 = pOVar13->encoding;
  goto LAB_0021b7e5;
code_r0x0021b8eb:
  uStack_1b0 = 1;
  uVar6 = 0x2d;
  switch(insn.eaBase) {
  case EA_BASE_NONE:
    if (insn.eaDisplacement != EA_DISP_NONE) {
      if (insn.mode != MODE_64BIT) {
        uVar6 = 0;
        uVar7 = 0;
        goto LAB_0021be57;
      }
      if (insn.prefix3 == 'g') {
        uVar6 = 0x1a;
      }
      else {
        uVar6 = 0x29;
      }
      MCOperand_CreateReg0(instr,uVar6);
      uVar6 = 0;
      uStack_1b0 = 1;
      goto LAB_0021bf42;
    }
    goto switchD_0021b7fc_caseD_b;
  case EA_BASE_BX_SI:
    uVar7 = 8;
    goto LAB_0021be57;
  case EA_BASE_BX_DI:
    uVar6 = 8;
    goto LAB_0021bdd8;
  case EA_BASE_BP_SI:
    uVar7 = 6;
LAB_0021be57:
    MCOperand_CreateReg0(instr,uVar7);
    goto LAB_0021bf42;
  case EA_BASE_BP_DI:
    uVar6 = 6;
LAB_0021bdd8:
    MCOperand_CreateReg0(instr,uVar6);
    uVar6 = 0xe;
    goto LAB_0021bf42;
  case EA_BASE_SI:
    uVar6 = 0x2d;
    break;
  case EA_BASE_DI:
    uVar6 = 0xe;
    break;
  case EA_BASE_BP:
    uVar6 = 6;
    break;
  case EA_BASE_BX:
    uVar6 = 8;
    break;
  case EA_BASE_R8W:
    uVar6 = 0xea;
    break;
  case EA_BASE_R9W:
    uVar6 = 0xeb;
    break;
  case EA_BASE_R10W:
    uVar6 = 0xec;
    break;
  case EA_BASE_R11W:
    uVar6 = 0xed;
    break;
  case EA_BASE_R12W:
    uVar6 = 0xee;
    break;
  case EA_BASE_R13W:
    uVar6 = 0xef;
    break;
  case EA_BASE_R14W:
    uVar6 = 0xf0;
    break;
  case EA_BASE_R15W:
    uVar6 = 0xf1;
    break;
  case EA_BASE_EAX:
    uVar6 = 0x13;
    break;
  case EA_BASE_ECX:
    uVar6 = 0x16;
    break;
  case EA_BASE_EDX:
    uVar6 = 0x18;
    break;
  case EA_BASE_EBX:
    uVar6 = 0x15;
    break;
  case EA_BASE_sib:
  case EA_BASE_sib64:
    if (0x20 < (ulong)insn.sibBase) goto switchD_0021b7fc_caseD_b;
    MCOperand_CreateReg0(instr,L" !BCDEFGHIJKLMNOPQ23456789:;<=>?@A)"[(ulong)insn.sibBase + 0x23]);
    uVar6 = MCInst_getOpcode(instr);
    if (((uVar6 - 0x12e6 < 0x14) && ((0xfc03fU >> (uVar6 - 0x12e6 & 0x1f) & 1) != 0)) ||
       (uVar6 - 0x1aac < 0xc)) {
      iVar5 = 0x71;
      if (((0xe < uVar6 - 0x12ea) || ((0x4801U >> (uVar6 - 0x12ea & 0x1f) & 1) == 0)) &&
         ((9 < uVar6 - 0x1aad || ((0x241U >> (uVar6 - 0x1aad & 0x1f) & 1) == 0)))) {
        iVar5 = (uint)(((uVar6 == 0x1ab2 || uVar6 == 0x1aac) || (uVar6 == 0x1ab0 || uVar6 == 0x1ab5)
                       ) || ((uVar6 == 0x12f4 || uVar6 == 0x12e9) || (uVar6 & 0xffffffef) == 0x12e7)
                      ) * 0x20 + 0x31;
      }
      iVar8 = 4;
      if (insn.sibIndex != SIB_INDEX_NONE) {
        iVar8 = (uint)(insn.addressSize != '\b') * 0x10 + insn.sibIndex + -0x21;
      }
      insn.sibIndex = iVar8 + iVar5;
    }
    if (insn.sibIndex == SIB_INDEX_NONE) {
      uVar6 = 0;
    }
    else {
      if (0x7f < insn.sibIndex - SIB_INDEX_EAX) goto switchD_0021b7fc_caseD_b;
      uVar6 = *(uint *)(&DAT_003ccb18 + (ulong)(insn.sibIndex - SIB_INDEX_EAX) * 4);
    }
    uStack_1b0 = (ulong)insn.sibScale;
    goto LAB_0021bf42;
  case EA_BASE_EBP:
    uVar6 = 0x14;
    break;
  case EA_BASE_ESI:
    uVar6 = 0x1d;
    break;
  case EA_BASE_EDI:
    uVar6 = 0x17;
    break;
  case EA_BASE_R8D:
    uVar6 = 0xe2;
    break;
  case EA_BASE_R9D:
    uVar6 = 0xe3;
    break;
  case EA_BASE_R10D:
    uVar6 = 0xe4;
    break;
  case EA_BASE_R11D:
    uVar6 = 0xe5;
    break;
  case EA_BASE_R12D:
    uVar6 = 0xe6;
    break;
  case EA_BASE_R13D:
    uVar6 = 0xe7;
    break;
  case EA_BASE_R14D:
    uVar6 = 0xe8;
    break;
  case EA_BASE_R15D:
    uVar6 = 0xe9;
    break;
  case EA_BASE_RAX:
    uVar6 = 0x23;
    break;
  case EA_BASE_RCX:
    uVar6 = 0x26;
    break;
  case EA_BASE_RDX:
    uVar6 = 0x28;
    break;
  case EA_BASE_RBX:
    uVar6 = 0x25;
    break;
  case EA_BASE_RBP:
    uVar6 = 0x24;
    break;
  case EA_BASE_RSI:
    uVar6 = 0x2b;
    break;
  case EA_BASE_RDI:
    uVar6 = 0x27;
    break;
  case EA_BASE_R8:
    uVar6 = 0x6a;
    break;
  case EA_BASE_R9:
    uVar6 = 0x6b;
    break;
  case EA_BASE_R10:
    uVar6 = 0x6c;
    break;
  case EA_BASE_R11:
    uVar6 = 0x6d;
    break;
  case EA_BASE_R12:
    uVar6 = 0x6e;
    break;
  case EA_BASE_R13:
    uVar6 = 0x6f;
    break;
  case EA_BASE_R14:
    uVar6 = 0x70;
    break;
  case EA_BASE_R15:
    uVar6 = 0x71;
    break;
  default:
    goto switchD_0021b7fc_caseD_b;
  }
  MCOperand_CreateReg0(instr,uVar6);
  uVar6 = 0;
LAB_0021bf42:
  MCOperand_CreateImm0(instr,uStack_1b0);
  MCOperand_CreateReg0(instr,uVar6);
  MCOperand_CreateImm0(instr,insn.displacement);
LAB_0021bf64:
  uVar6 = (uint)""[insn.segmentOverride];
LAB_0021bf79:
  MCOperand_CreateReg0(instr,uVar6);
  goto LAB_0021bf7e;
switchD_0021b7fc_caseD_1:
  reg = insn.reg;
LAB_0021b8cd:
  translateRegister(instr,reg);
LAB_0021bf7e:
  lVar14 = lVar14 + 1;
  goto LAB_0021b7bc;
}

Assistant:

bool X86_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *instr, uint16_t *size, uint64_t address, void *_info)
{
	cs_struct *handle = (cs_struct *)(uintptr_t)ud;
	InternalInstruction insn = {0};
	struct reader_info info;
	int ret;
	bool result;

	info.code = code;
	info.size = code_len;
	info.offset = address;

	if (instr->flat_insn->detail) {
		// instr->flat_insn->detail initialization: 3 alternatives

		// 1. The whole structure, this is how it's done in other arch disassemblers
		// Probably overkill since cs_detail is huge because of the 36 operands of ARM
		
		//memset(instr->flat_insn->detail, 0, sizeof(cs_detail));

		// 2. Only the part relevant to x86
		memset(instr->flat_insn->detail, 0, offsetof(cs_detail, x86) + sizeof(cs_x86));

		// 3. The relevant part except for x86.operands
		// sizeof(cs_x86) is 0x1c0, sizeof(x86.operands) is 0x180
		// marginally faster, should be okay since x86.op_count is set to 0

		//memset(instr->flat_insn->detail, 0, offsetof(cs_detail, x86)+offsetof(cs_x86, operands));
	}

	if (handle->mode & CS_MODE_16)
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_16BIT);
	else if (handle->mode & CS_MODE_32)
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_32BIT);
	else
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_64BIT);

	if (ret) {
		*size = (uint16_t)(insn.readerCursor - address);
		// handle some special cases here.
		// FIXME: fix this in the next major update.
		switch(*size) {
			default:
				break;
			case 2: {
						unsigned char b1 = 0, b2 = 0;

						reader(&info, &b1, address);
						reader(&info, &b2, address + 1);
						if (b1 == 0x0f && b2 == 0xff) {
							instr->Opcode = X86_UD0;
							instr->OpcodePub = X86_INS_UD0;
							strncpy(instr->assembly, "ud0", 4);
							if (instr->flat_insn->detail) {
								instr->flat_insn->detail->x86.opcode[0] = b1;
								instr->flat_insn->detail->x86.opcode[1] = b2;
							}
							return true;
						}
				}
				return false;
			case 4: {
						if (handle->mode != CS_MODE_16) {
							unsigned char b1 = 0, b2 = 0, b3 = 0, b4 = 0;

							reader(&info, &b1, address);
							reader(&info, &b2, address + 1);
							reader(&info, &b3, address + 2);
							reader(&info, &b4, address + 3);

							if (b1 == 0xf3 && b2 == 0x0f && b3 == 0x1e && b4 == 0xfa) {
								instr->Opcode = X86_ENDBR64;
								instr->OpcodePub = X86_INS_ENDBR64;
								strncpy(instr->assembly, "endbr64", 8);
								if (instr->flat_insn->detail) {
									instr->flat_insn->detail->x86.opcode[0] = b1;
									instr->flat_insn->detail->x86.opcode[1] = b2;
									instr->flat_insn->detail->x86.opcode[2] = b3;
									instr->flat_insn->detail->x86.opcode[3] = b4;
								}
								return true;
							} else if (b1 == 0xf3 && b2 == 0x0f && b3 == 0x1e && b4 == 0xfb) {
								instr->Opcode = X86_ENDBR32;
								instr->OpcodePub = X86_INS_ENDBR32;
								strncpy(instr->assembly, "endbr32", 8);
								if (instr->flat_insn->detail) {
									instr->flat_insn->detail->x86.opcode[0] = b1;
									instr->flat_insn->detail->x86.opcode[1] = b2;
									instr->flat_insn->detail->x86.opcode[2] = b3;
									instr->flat_insn->detail->x86.opcode[3] = b4;
								}
								return true;
							}
						}
				}
				return false;
		}

		return false;
	} else {
		*size = (uint16_t)insn.length;

		result = (!translateInstruction(instr, &insn)) ?  true : false;
		if (result) {
			// quick fix for #904. TODO: fix this properly in the next update
			if (handle->mode & CS_MODE_64) {
				if (instr->Opcode == X86_LES16rm || instr->Opcode == X86_LES32rm)
					// LES is invalid in x64
					return false;
				if (instr->Opcode == X86_LDS16rm || instr->Opcode == X86_LDS32rm)
					// LDS is invalid in x64
					return false;
			}

			instr->imm_size = insn.immSize;
			if (handle->detail) {
				update_pub_insn(instr->flat_insn, &insn, instr->x86_prefix);
			} else {
				// still copy all prefixes
				instr->x86_prefix[0] = insn.prefix0;
				instr->x86_prefix[1] = insn.prefix1;
				instr->x86_prefix[2] = insn.prefix2;
				instr->x86_prefix[3] = insn.prefix3;
			}
		}

		return result;
	}
}